

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O1

void __thiscall FIX::DataDictionary::checkValidFormat(DataDictionary *this,FieldBase *field)

{
  int iVar1;
  undefined4 uVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  UtcTimeOnly local_60;
  UtcDate local_48;
  UtcTimeStamp local_30;
  
  iVar1 = field->m_tag;
  p_Var5 = &(this->m_fieldTypes)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->m_fieldTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var5->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < iVar1]) {
    if (iVar1 <= (int)p_Var4[1]._M_color) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var5->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var5) && (p_Var4 = p_Var3, iVar1 < (int)p_Var3[1]._M_color)) {
    p_Var4 = &p_Var5->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 == p_Var5) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(undefined4 *)&p_Var4[1].field_0x4;
  }
  switch(uVar2) {
  case 2:
    CharConvertor::convert(&field->m_string);
    break;
  case 3:
  case 5:
  case 6:
  case 0x11:
  case 0x12:
  case 0x18:
    DoubleConvertor::convert(&field->m_string);
    break;
  case 4:
  case 0x17:
  case 0x1a:
  case 0x1b:
    IntTConvertor<int>::convert(&field->m_string);
    break;
  case 0xc:
    UtcTimeStampConvertor::convert(&local_30,&field->m_string);
    break;
  case 0xd:
    BoolConvertor::convert(&field->m_string);
    break;
  case 0x15:
    UtcDateConvertor::convert(&local_48,&field->m_string);
    break;
  case 0x16:
    UtcTimeOnlyConvertor::convert(&local_60,&field->m_string);
    break;
  case 0x19:
    IntTConvertor<unsigned_long>::convert(&field->m_string);
  }
  return;
}

Assistant:

EXCEPT(IncorrectDataFormat) {
    try {
      TYPE::Type type = TYPE::Unknown;
      getFieldType(field.getTag(), type);
      switch (type) {
      case TYPE::String:
        STRING_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Char:
        CHAR_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Price:
        PRICE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Int:
        INT_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Amt:
        AMT_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Qty:
        QTY_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Currency:
        CURRENCY_CONVERTOR::convert(field.getString());
        break;
      case TYPE::MultipleValueString:
        MULTIPLEVALUESTRING_CONVERTOR::convert(field.getString());
        break;
      case TYPE::MultipleStringValue:
        MULTIPLESTRINGVALUE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::MultipleCharValue:
        MULTIPLECHARVALUE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Exchange:
        EXCHANGE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::UtcTimeStamp:
        UTCTIMESTAMP_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Boolean:
        BOOLEAN_CONVERTOR::convert(field.getString());
        break;
      case TYPE::LocalMktTime:
        LOCALMKTTIME_CONVERTOR::convert(field.getString());
        break;
      case TYPE::LocalMktDate:
        LOCALMKTDATE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Data:
        DATA_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Float:
        FLOAT_CONVERTOR::convert(field.getString());
        break;
      case TYPE::PriceOffset:
        PRICEOFFSET_CONVERTOR::convert(field.getString());
        break;
      case TYPE::MonthYear:
        MONTHYEAR_CONVERTOR::convert(field.getString());
        break;
      case TYPE::DayOfMonth:
        DAYOFMONTH_CONVERTOR::convert(field.getString());
        break;
      case TYPE::UtcDate:
        UTCDATE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::UtcTimeOnly:
        UTCTIMEONLY_CONVERTOR::convert(field.getString());
        break;
      case TYPE::NumInGroup:
        NUMINGROUP_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Percentage:
        PERCENTAGE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::SeqNum:
        SEQNUM_CONVERTOR::convert(field.getString());
        break;
      case TYPE::TagNum:
        TAGNUM_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Length:
        LENGTH_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Country:
        COUNTRY_CONVERTOR::convert(field.getString());
        break;
      case TYPE::TzTimeOnly:
        TZTIMEONLY_CONVERTOR::convert(field.getString());
        break;
      case TYPE::TzTimeStamp:
        TZTIMESTAMP_CONVERTOR::convert(field.getString());
        break;
      case TYPE::XmlData:
        XMLDATA_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Language:
        LANGUAGE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Xid:
        XID_CONVERTOR::convert(field.getString());
        break;
      case TYPE::XidRef:
        XIDREF_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Unknown:
        break;
      }
    } catch (FieldConvertError &) {
      throw IncorrectDataFormat(field.getTag(), field.getString());
    }
  }